

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::UniversalTersePrint(char *str,iu_ostream *os)

{
  allocator<char> local_31;
  char *local_30 [4];
  
  if (str != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_30,str,&local_31);
    std::operator<<(os,local_30[0]);
    std::__cxx11::string::~string((string *)local_30);
    return;
  }
  std::operator<<(os,"(null)");
  return;
}

Assistant:

inline void IUTEST_ATTRIBUTE_UNUSED_ UniversalTersePrint(const char* str, iu_ostream* os)
{
    if( str == IUTEST_NULLPTR )
    {
        *os << kStrings::Null;
    }
    else
    {
        UniversalPrint(::std::string(str), os);
    }
}